

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O2

_Bool ZBufferTestAndUpdate(ZBuffer *zbuffer,uint16_t x,uint16_t y,Real depth)

{
  undefined1 depth_00 [16];
  _Bool _Var1;
  uint16_t in_CX;
  undefined6 in_register_00000012;
  ushort x_00;
  ulong uVar2;
  undefined6 in_register_00000032;
  longdouble in_ST0;
  undefined6 in_stack_ffffffffffffffa2;
  
  uVar2 = CONCAT62(in_register_00000012,y) & 0xffffffff;
  if ((x < zbuffer->imageWidth) && (x_00 = (ushort)uVar2, x_00 < zbuffer->imageHeight)) {
    ZBufferGetDepth((Real *)zbuffer,(ZBuffer *)(ulong)x,x_00,in_CX);
    if (depth._0_10_ <= in_ST0) {
      depth_00._10_6_ = in_stack_ffffffffffffffa2;
      depth_00._0_10_ = depth._0_10_;
      _Var1 = ZBufferSetDepth(zbuffer,x,x_00,(Real)depth_00);
      return _Var1;
    }
    fprintf(_stderr,"%s: Deeper than current depth (%d, %d) = %Lf < %Lf\n","ZBufferTestAndUpdate",
            CONCAT62(in_register_00000032,x) & 0xffffffff,uVar2);
  }
  else {
    fprintf(_stderr,"%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n","ZBufferTestAndUpdate",
            CONCAT62(in_register_00000032,x) & 0xffffffff,(ulong)zbuffer->imageWidth,uVar2,
            (uint)zbuffer->imageHeight);
  }
  return false;
}

Assistant:

bool ZBufferTestAndUpdate(ZBuffer *zbuffer, uint16_t x, uint16_t y, Real depth) {
  const uint16_t imageWidth = zbuffer->imageWidth;
  const uint16_t imageHeight = zbuffer->imageHeight;
  if (imageWidth <= x || imageHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, imageWidth, y, imageHeight);
#endif
    return false;
  }
  Real currentDepth = ZBufferGetDepth(zbuffer, x, y);
  if (currentDepth < depth) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Deeper than current depth (%d, %d) = %Lf < %Lf\n", __FUNCTION_NAME__, x, y, currentDepth, depth);
#endif
    return false;
  }
  return ZBufferSetDepth(zbuffer, x, y, depth);
}